

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMessageMapGetters
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  Printer *pPVar3;
  Options *pOVar4;
  undefined1 uVar5;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2e0;
  string_view local_2d8;
  string_view local_2c8;
  string_view local_2b8;
  FieldDescriptor local_2a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  string_view local_238;
  string_view local_228;
  FieldDescriptor local_218;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  string_view local_1a8;
  string_view local_198;
  FieldDescriptor local_188;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  string_view local_118;
  string_view local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string_view local_d8;
  string_view local_c8 [2];
  FieldDescriptor local_a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return internalGet$capitalized_name$().ensureBuilderMap().size();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_50);
  end_varname_03._M_str = local_48._M_str;
  end_varname_03._M_len = local_48._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_38,end_varname_03,pFVar1,local_50);
  pPVar3 = local_18;
  uVar5 = SUB81(local_48._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_a8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_a8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_c8,
             "@java.lang.Override\n$deprecation$public boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().ensureBuilderMap().containsKey(key);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_c8[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_f0);
  end_varname_02._M_str = local_e8._M_str;
  end_varname_02._M_len = local_e8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_d8,end_varname_02,pFVar1,local_f0);
  uVar5 = SUB81(local_e8._M_str,0);
  pOVar4 = Context::options(this->context_);
  pPVar2 = local_18;
  if ((pOVar4->opensource_runtime & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_108,
               "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_108);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_130);
    end_varname_01._M_str = local_128._M_str;
    end_varname_01._M_len = local_128._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_118,end_varname_01,pFVar1,local_130);
    uVar5 = SUB81(local_128._M_str,0);
  }
  pPVar3 = local_18;
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_188,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_188,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_188);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "@java.lang.Override\n$deprecation$public java.util.Map<$type_parameters$> ${$get$capitalized_name$Map$}$() {\n  return internalGet$capitalized_name$().getImmutableMap();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1c0);
  end_varname_00._M_str = local_1b8._M_str;
  end_varname_00._M_len = local_1b8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1a8,end_varname_00,pFVar1,local_1c0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_1b8._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_218,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_218,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_218);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_228,
             "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $value_interface_type$> map = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  return map.containsKey(key) ? $name$Converter.build(map.get(key)) : defaultValue;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_228);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_238,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_250);
  end_varname._M_str = local_248._M_str;
  end_varname._M_len = local_248._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_238,end_varname,pFVar1,local_250);
  pPVar3 = local_18;
  uVar5 = SUB81(local_248._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_2a8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_2a8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_2a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2b8,
             "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $value_interface_type$> map = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$Converter.build(map.get(key));\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_2b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_2e0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2c8,local_2d8,pFVar1,local_2e0);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMessageMapGetters(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return internalGet$capitalized_name$().ensureBuilderMap().size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public boolean ${$contains$capitalized_name$$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return "
      "internalGet$capitalized_name$().ensureBuilderMap().containsKey(key);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (context_->options().opensource_runtime) {
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Override\n"
                   "@java.lang.Deprecated\n"
                   "public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$$}$() {\n"
                   "  return get$capitalized_name$Map();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.Map<$type_parameters$> "
                 "${$get$capitalized_name$Map$}$() {\n"
                 "  return internalGet$capitalized_name$().getImmutableMap();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $value_type_pass_through_nullness$ "
      "${$get$capitalized_name$OrDefault$}$(\n"
      "    $key_type$ key,\n"
      "    $value_type_pass_through_nullness$ defaultValue) {\n"
      "  $key_null_check$\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> map = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  return map.containsKey(key) ? $name$Converter.build(map.get(key)) : "
      "defaultValue;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> map = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  if (!map.containsKey(key)) {\n"
      "    throw new java.lang.IllegalArgumentException();\n"
      "  }\n"
      "  return $name$Converter.build(map.get(key));\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}